

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

void CLI::AsNumberWithUnit::validate_mapping<float>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                *mapping,Options opts)

{
  mapped_type_conflict2 mVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  size_type sVar5;
  ValidationError *pVVar6;
  mapped_type_conflict2 *pmVar7;
  string local_1b0;
  string local_190;
  undefined1 local_16a;
  allocator local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  undefined1 local_108 [8];
  string s;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
  *kv_1;
  iterator __end0_1;
  iterator __begin0_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
  *__range3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
  lower_mapping;
  string local_90;
  undefined1 local_6d;
  allocator local_59;
  string local_58;
  reference local_38;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
  *kv;
  iterator __end0;
  iterator __begin0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
  *__range2;
  Options opts_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
  *mapping_local;
  
  __end0 = _GLOBAL__N_1::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
           ::begin(mapping);
  kv = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
        *)_GLOBAL__N_1::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
          ::end(mapping);
  while( true ) {
    bVar2 = _GLOBAL__N_1::std::operator!=(&__end0,(_Self *)&kv);
    if (!bVar2) {
      if ((opts & CASE_INSENSITIVE) != CASE_SENSITIVE) {
        _GLOBAL__N_1::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
               *)&__range3);
        __end0_1 = _GLOBAL__N_1::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                   ::begin(mapping);
        kv_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
                *)_GLOBAL__N_1::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                  ::end(mapping);
        while( true ) {
          bVar2 = _GLOBAL__N_1::std::operator!=(&__end0_1,(_Self *)&kv_1);
          if (!bVar2) break;
          s.field_2._8_8_ =
               _GLOBAL__N_1::std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>
               ::operator*(&__end0_1);
          std::__cxx11::string::string((string *)&local_128,(string *)s.field_2._8_8_);
          detail::to_lower((string *)local_108,&local_128);
          std::__cxx11::string::~string((string *)&local_128);
          sVar5 = _GLOBAL__N_1::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                  ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                           *)&__range3,(key_type *)local_108);
          if (sVar5 != 0) {
            local_16a = 1;
            pVVar6 = (ValidationError *)__cxa_allocate_exception(0x38);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_168,
                       "Several matching lowercase unit representations are found: ",&local_169);
            std::operator+(&local_148,&local_168,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_108);
            ValidationError::ValidationError(pVVar6,&local_148);
            local_16a = 0;
            __cxa_throw(pVVar6,&ValidationError::typeinfo,ValidationError::~ValidationError);
          }
          mVar1 = *(mapped_type_conflict2 *)(s.field_2._8_8_ + 0x20);
          std::__cxx11::string::string((string *)&local_1b0,(string *)s.field_2._8_8_);
          detail::to_lower(&local_190,&local_1b0);
          pmVar7 = _GLOBAL__N_1::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                                 *)&__range3,&local_190);
          *pmVar7 = mVar1;
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)local_108);
          _GLOBAL__N_1::std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>
          ::operator++(&__end0_1);
        }
        _GLOBAL__N_1::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
        ::operator=(mapping,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                             *)&__range3);
        _GLOBAL__N_1::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                *)&__range3);
      }
      return;
    }
    local_38 = _GLOBAL__N_1::std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>
               ::operator*(&__end0);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      local_6d = 1;
      pVVar6 = (ValidationError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_58,"Unit must not be empty.",&local_59);
      ValidationError::ValidationError(pVVar6,&local_58);
      local_6d = 0;
      __cxa_throw(pVVar6,&ValidationError::typeinfo,ValidationError::~ValidationError);
    }
    uVar3 = detail::isalpha((int)local_38);
    if ((uVar3 & 1) == 0) break;
    _GLOBAL__N_1::std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>
    ::operator++(&__end0);
  }
  lower_mapping._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
  pVVar6 = (ValidationError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_90,"Unit must contain only letters.",
             (allocator *)
             ((long)&lower_mapping._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  ValidationError::ValidationError(pVVar6,&local_90);
  lower_mapping._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
  __cxa_throw(pVVar6,&ValidationError::typeinfo,ValidationError::~ValidationError);
}

Assistant:

static void validate_mapping(std::map<std::string, Number> &mapping, Options opts) {
        for(auto &kv : mapping) {
            if(kv.first.empty()) {
                throw ValidationError("Unit must not be empty.");
            }
            if(!detail::isalpha(kv.first)) {
                throw ValidationError("Unit must contain only letters.");
            }
        }

        // make all units lowercase if CASE_INSENSITIVE
        if(opts & CASE_INSENSITIVE) {
            std::map<std::string, Number> lower_mapping;
            for(auto &kv : mapping) {
                auto s = detail::to_lower(kv.first);
                if(lower_mapping.count(s)) {
                    throw ValidationError(std::string("Several matching lowercase unit representations are found: ") +
                                          s);
                }
                lower_mapping[detail::to_lower(kv.first)] = kv.second;
            }
            mapping = std::move(lower_mapping);
        }
    }